

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O2

unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>,_true> __thiscall
duckdb::DatePart::
PropagateDatePartStatistics<duckdb::timestamp_t,duckdb::DatePart::JulianDayOperator,double>
          (DatePart *this,vector<duckdb::BaseStatistics,_true> *child_stats,LogicalType *stats_type)

{
  char cVar1;
  bool bVar2;
  reference stats;
  timestamp_t tVar3;
  timestamp_t tVar4;
  double dVar5;
  double dVar6;
  BaseStatistics result;
  Value local_d8 [64];
  LogicalType local_98 [24];
  BaseStatistics local_80 [88];
  
  stats = vector<duckdb::BaseStatistics,_true>::get<true>(child_stats,0);
  cVar1 = duckdb::NumericStats::HasMinMax(stats);
  if (cVar1 != '\0') {
    tVar3 = NumericStats::GetMin<duckdb::timestamp_t>(stats);
    tVar4 = NumericStats::GetMax<duckdb::timestamp_t>(stats);
    if (((tVar3.value <= tVar4.value) &&
        (bVar2 = duckdb::Value::IsFinite<duckdb::timestamp_t>(tVar3), bVar2)) &&
       (bVar2 = duckdb::Value::IsFinite<duckdb::timestamp_t>(tVar4), bVar2)) {
      dVar5 = (double)duckdb::Timestamp::GetJulianDay(tVar3);
      dVar6 = (double)duckdb::Timestamp::GetJulianDay(tVar4);
      duckdb::LogicalType::LogicalType(local_98,stats_type);
      duckdb::NumericStats::CreateEmpty(local_80,local_98);
      duckdb::LogicalType::~LogicalType(local_98);
      duckdb::Value::Value(local_d8,dVar5);
      duckdb::NumericStats::SetMin(local_80,local_d8);
      duckdb::Value::~Value(local_d8);
      duckdb::Value::Value(local_d8,dVar6);
      duckdb::NumericStats::SetMax(local_80,local_d8);
      duckdb::Value::~Value(local_d8);
      vector<duckdb::BaseStatistics,_true>::get<true>(child_stats,0);
      duckdb::BaseStatistics::CopyValidity(local_80);
      duckdb::BaseStatistics::ToUnique();
      duckdb::BaseStatistics::~BaseStatistics(local_80);
      return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
             (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
    }
  }
  *(undefined8 *)this = 0;
  return (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)
         (unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>)this;
}

Assistant:

static unique_ptr<BaseStatistics> PropagateDatePartStatistics(vector<BaseStatistics> &child_stats,
	                                                              const LogicalType &stats_type = LogicalType::BIGINT) {
		// we can only propagate complex date part stats if the child has stats
		auto &nstats = child_stats[0];
		if (!NumericStats::HasMinMax(nstats)) {
			return nullptr;
		}
		// run the operator on both the min and the max, this gives us the [min, max] bound
		auto min = NumericStats::GetMin<T>(nstats);
		auto max = NumericStats::GetMax<T>(nstats);
		if (min > max) {
			return nullptr;
		}
		// Infinities prevent us from computing generic ranges
		if (!Value::IsFinite(min) || !Value::IsFinite(max)) {
			return nullptr;
		}
		TR min_part = OP::template Operation<T, TR>(min);
		TR max_part = OP::template Operation<T, TR>(max);
		auto result = NumericStats::CreateEmpty(stats_type);
		NumericStats::SetMin(result, Value(min_part));
		NumericStats::SetMax(result, Value(max_part));
		result.CopyValidity(child_stats[0]);
		return result.ToUnique();
	}